

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.hpp
# Opt level: O2

void duckdb_hll::sdssetalloc(sds s,size_t newlen)

{
  switch(s[-1] & 7) {
  case 1:
    s[-3] = (char)newlen;
    return;
  case 2:
    *(short *)(s + -4) = (short)newlen;
    return;
  case 3:
    *(int *)(s + -6) = (int)newlen;
    return;
  case 4:
    *(size_t *)(s + -10) = newlen;
  }
  return;
}

Assistant:

static inline void sdssetalloc(sds s, size_t newlen) {
    unsigned char flags = s[-1];
    switch(flags&SDS_TYPE_MASK) {
        case SDS_TYPE_5:
            /* Nothing to do, this type has no total allocation info. */
            break;
        case SDS_TYPE_8:
            SDS_HDR(8,s)->alloc = newlen;
            break;
        case SDS_TYPE_16:
            SDS_HDR(16,s)->alloc = newlen;
            break;
        case SDS_TYPE_32:
            SDS_HDR(32,s)->alloc = newlen;
            break;
        case SDS_TYPE_64:
            SDS_HDR(64,s)->alloc = newlen;
            break;
    }
}